

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O3

int __thiscall pbrt::InfiniteLightSource::writeTo(InfiniteLightSource *this,BinaryWriter *binary)

{
  size_t in_RCX;
  void *in_RDX;
  
  BinaryWriter::write(binary,(int)this + 0x18,in_RDX,in_RCX);
  BinaryWriter::writeRaw(binary,&this->transform,0x30);
  BinaryWriter::writeRaw(binary,&this->L,0xc);
  BinaryWriter::writeRaw(binary,&this->scale,0xc);
  BinaryWriter::writeRaw(binary,&this->nSamples,4);
  return 0x46;
}

Assistant:

int InfiniteLightSource::writeTo(BinaryWriter &binary) 
  {
    binary.write(mapName);
    binary.write(transform);
    binary.write(L);
    binary.write(scale);
    binary.write(nSamples);
    return TYPE_INFINITE_LIGHT_SOURCE;
  }